

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhinull.cpp
# Opt level: O2

void __thiscall QRhiNull::simulateTextureGenMips(QRhiNull *this,TextureOp *u)

{
  QRhiTexture *pQVar1;
  QImage *this_00;
  int iVar2;
  reference this_01;
  size_type __n;
  long in_FS_OFFSET;
  QSize local_60;
  QImage local_58;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = u->dst;
  local_40 = pQVar1->m_pixelSize;
  iVar2 = QRhi::mipLevelsForSize(&local_40);
  for (__n = 1; (long)__n < (long)iVar2; __n = __n + 1) {
    this_00 = (QImage *)pQVar1[1].super_QRhiResource.m_id;
    local_60 = QRhi::sizeForMipLevel((int)__n,&local_40);
    QImage::scaled(&local_58,this_00,&local_60,IgnoreAspectRatio,FastTransformation);
    this_01 = std::array<QImage,_16UL>::operator[]
                        ((array<QImage,_16UL> *)pQVar1[1].super_QRhiResource.m_id,__n);
    QImage::operator=(this_01,&local_58);
    QImage::~QImage(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiNull::simulateTextureGenMips(const QRhiResourceUpdateBatchPrivate::TextureOp &u)
{
    QNullTexture *texD = QRHI_RES(QNullTexture, u.dst);
    const QSize baseSize = texD->pixelSize();
    const int levelCount = q->mipLevelsForSize(baseSize);
    for (int level = 1; level < levelCount; ++level)
        texD->image[0][level] = texD->image[0][0].scaled(q->sizeForMipLevel(level, baseSize));
}